

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEDate.cpp
# Opt level: O1

double CEDate::Gregorian2JD(double gregorian)

{
  double dVar1;
  vector<double,_std::allocator<double>_> gregorian_vect;
  vector<double,_std::allocator<double>_> local_38;
  vector<double,_std::allocator<double>_> local_20;
  
  Gregorian2GregorianVect(&local_20,gregorian);
  std::vector<double,_std::allocator<double>_>::vector(&local_38,&local_20);
  dVar1 = GregorianVect2JD(&local_38);
  std::vector<double,_std::allocator<double>_>::~vector(&local_38);
  std::vector<double,_std::allocator<double>_>::~vector(&local_20);
  return dVar1;
}

Assistant:

double CEDate::Gregorian2JD(double gregorian)
{
    // First convert the gregorian double into a gregorian vector
    std::vector<double> gregorian_vect = Gregorian2GregorianVect(gregorian) ;
    
    return GregorianVect2JD(gregorian_vect) ;
}